

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_discover.cc
# Opt level: O2

int runDiscover(string *command,int argc,char **argv)

{
  pointer pDVar1;
  bool bVar2;
  bool iponly;
  bool serialonly;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  DeviceInfo *extraout_RDX;
  DeviceInfo *extraout_RDX_00;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  _Var8;
  DeviceInfo *extraout_RDX_01;
  DeviceInfo *extraout_RDX_02;
  const_iterator __first;
  bool print_header;
  DeviceInfo *info;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  __it1;
  pointer device_info;
  int iVar9;
  DeviceInfo *this;
  int local_124;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> infos;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> filtered_infos;
  Discover discover;
  DeviceFilter device_filter;
  
  device_filter.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  device_filter.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  device_filter.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  device_filter.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  device_filter.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  device_filter.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  device_filter.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  device_filter.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  device_filter.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  device_filter.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  device_filter.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  device_filter.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  device_filter.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  device_filter.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  device_filter.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  print_header = true;
  iVar9 = 0;
  serialonly = false;
  iponly = false;
  while (iVar9 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&discover,argv[iVar9],(allocator<char> *)&infos);
    iVar9 = iVar9 + 1;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &discover,"-iponly");
    bVar3 = true;
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&discover,"--iponly"), bVar2)) {
      print_header = false;
      iponly = true;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &discover,"-serialonly");
      bVar3 = true;
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&discover,"--serialonly"), bVar2)) {
        print_header = false;
        serialonly = true;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&discover,"-f");
        if (bVar2) {
          iVar4 = parseFilterArguments(argc - iVar9,argv + iVar9,&device_filter);
          iVar9 = iVar9 + iVar4;
          print_header = false;
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&discover,"-h");
          if ((bVar3) ||
             (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&discover,"--help"), bVar3)) {
            bVar3 = false;
            printHelp((ostream *)&std::cout,command);
            local_124 = 0;
          }
          else {
            poVar5 = std::operator<<((ostream *)&std::cerr,"Invalid argument: ");
            poVar5 = std::operator<<(poVar5,(string *)&discover);
            std::operator<<(poVar5,'\n');
            printHelp((ostream *)&std::cerr,command);
            bVar3 = false;
            local_124 = 1;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&discover);
    if (!bVar3) goto LAB_00111074;
  }
  rcdiscover::Discover::Discover(&discover);
  rcdiscover::Discover::broadcastRequest(&discover);
  infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  lVar7 = lVar6;
  while ((bVar3 = rcdiscover::Discover::getResponse(&discover,&infos,100), bVar3 ||
         ((double)(lVar7 - lVar6) / 1000000.0 < 1000.0))) {
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<rcdiscover::DeviceInfo*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (infos.
             super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
             _M_impl.super__Vector_impl_data._M_start,
             infos.
             super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  __first._M_current =
       infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  _Var8._M_current = extraout_RDX;
  __it1._M_current =
       infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  if (infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      this = __it1._M_current;
      __it1._M_current = this + 1;
      if (__it1._M_current == __first._M_current) goto LAB_00110fc0;
      bVar3 = __gnu_cxx::__ops::
              _Iter_comp_iter<runDiscover(std::__cxx11::string_const&,int,char**)::$_0>::operator()
                        (this,__it1,_Var8);
      _Var8._M_current = extraout_RDX_00;
    } while (!bVar3);
    while (__it1._M_current = __it1._M_current + 1, __it1._M_current != __first._M_current) {
      bVar3 = __gnu_cxx::__ops::
              _Iter_comp_iter<runDiscover(std::__cxx11::string_const&,int,char**)::$_0>::operator()
                        (this,__it1,_Var8);
      _Var8._M_current = extraout_RDX_01;
      if (!bVar3) {
        this = this + 1;
        rcdiscover::DeviceInfo::operator=(this,__it1._M_current);
        _Var8._M_current = extraout_RDX_02;
      }
    }
    __first._M_current = this + 1;
  }
LAB_00110fc0:
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::erase
            (&infos,__first,
             (const_iterator)
             infos.
             super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  pDVar1 = infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  filtered_infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  filtered_infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filtered_infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (device_info = infos.
                     super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start; device_info != pDVar1;
      device_info = device_info + 1) {
    if ((device_info->mac != 0) && (bVar3 = filterDevice(device_info,&device_filter), bVar3)) {
      std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::push_back
                (&filtered_infos,device_info);
    }
  }
  printDeviceTable((ostream *)&std::cout,&filtered_infos,print_header,iponly,serialonly);
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector
            (&filtered_infos);
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector(&infos);
  rcdiscover::Discover::~Discover(&discover);
  local_124 = 0;
LAB_00111074:
  DeviceFilter::~DeviceFilter(&device_filter);
  return local_124;
}

Assistant:

int runDiscover(const std::string &command, int argc, char **argv)
{
  // interpret command line parameters

  bool printheader = true;
  bool iponly = false;
  bool serialonly = false;
  DeviceFilter device_filter;

  int i = 0;
  while (i < argc)
  {
    std::string p = argv[i++];

    if (p == "-iponly" || p == "--iponly")
    {
      iponly = true;
      printheader = false;
    }
    else if (p == "-serialonly" || p == "--serialonly")
    {
      serialonly = true;
      printheader = false;
    }
    else if (p == "-f")
    {
      try
      {
        i += parseFilterArguments(argc - i, argv + i, device_filter);
      }
      catch (const std::invalid_argument &ex)
      {
        std::cerr << ex.what() << std::endl;
        return 1;
      }

      printheader = false;
    }
    else if (p == "-h" || p == "--help")
    {
      printHelp(std::cout, command);
      return 0;
    }
    else
    {
      std::cerr << "Invalid argument: " << p << '\n';
      printHelp(std::cerr, command);
      return 1;
    }
  }

  // broadcast discover request

  rcdiscover::Discover discover;
  discover.broadcastRequest();

  std::vector<rcdiscover::DeviceInfo> infos;

  // get all responses, sort them and remove multiple entries

  std::chrono::steady_clock::time_point tstart=std::chrono::steady_clock::now();
  std::chrono::steady_clock::time_point tend=tstart;

  while (discover.getResponse(infos, 100) ||
    std::chrono::duration<double, std::milli>(tend-tstart).count() < 1000)
  {
    tend=std::chrono::steady_clock::now();
  }

  std::sort(infos.begin(), infos.end());
  const auto it = std::unique(infos.begin(), infos.end(),
                              [](const rcdiscover::DeviceInfo &lhs,
                                 const rcdiscover::DeviceInfo &rhs)
                              {
                                return lhs.getMAC() == rhs.getMAC() &&
                                       lhs.getIfaceName() == rhs.getIfaceName();
                              });
  infos.erase(it, infos.end());

  // go through all valid entries

  std::vector<rcdiscover::DeviceInfo> filtered_infos;
  for (rcdiscover::DeviceInfo &info : infos)
  {
    if (!info.isValid())
    {
      continue;
    }

    // filter as requested
    if (!filterDevice(info, device_filter)) continue;

    filtered_infos.push_back(info);
  }

  printDeviceTable(std::cout, filtered_infos, printheader, iponly, serialonly);

  return 0;
}